

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_1::renderTestPatternReference(PixelBufferAccess *dst)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TextureFormat *pTVar6;
  int *piVar7;
  pointer pVVar8;
  int newVal;
  int oldVal;
  int x;
  int y;
  int y1;
  int x1;
  int y0;
  int x0;
  __normal_iterator<tcu::Vector<int,_4>_*,_std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>_>
  local_90;
  __normal_iterator<const_tcu::Vector<int,_4>_*,_std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>_>
  local_88;
  const_iterator rectIter;
  undefined1 local_70 [8];
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> rects;
  deUint32 stencilMask;
  tcu local_24 [16];
  int local_14;
  ConstPixelBufferAccess *pCStack_10;
  int stencilBits;
  PixelBufferAccess *dst_local;
  
  pCStack_10 = &dst->super_ConstPixelBufferAccess;
  tcu::getEffectiveDepthStencilAccess
            ((PixelBufferAccess *)&stack0xffffffffffffffb0,dst,MODE_STENCIL);
  pTVar6 = tcu::ConstPixelBufferAccess::getFormat
                     ((ConstPixelBufferAccess *)&stack0xffffffffffffffb0);
  tcu::getTextureFormatBitDepth(local_24,pTVar6);
  piVar7 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_24);
  local_14 = *piVar7;
  rects.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (1 << ((byte)local_14 & 0x1f)) - 1;
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_70);
  pTVar6 = tcu::ConstPixelBufferAccess::getFormat(pCStack_10);
  if (pTVar6->order == DS) {
    tcu::clearDepth((PixelBufferAccess *)pCStack_10,0.0);
  }
  tcu::clearStencil((PixelBufferAccess *)pCStack_10,0);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(pCStack_10);
  iVar3 = tcu::ConstPixelBufferAccess::getHeight(pCStack_10);
  genTestRects((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_70,iVar2,
               iVar3);
  local_90._M_current =
       (Vector<int,_4> *)
       std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::begin
                 ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_70);
  __gnu_cxx::
  __normal_iterator<tcu::Vector<int,4>const*,std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>>
  ::__normal_iterator<tcu::Vector<int,4>*>
            ((__normal_iterator<tcu::Vector<int,4>const*,std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>>
              *)&local_88,&local_90);
  while( true ) {
    _y0 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::end
                    ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_70)
    ;
    bVar1 = __gnu_cxx::operator!=
                      (&local_88,
                       (__normal_iterator<tcu::Vector<int,_4>_*,_std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>_>
                        *)&y0);
    if (!bVar1) break;
    pVVar8 = __gnu_cxx::
             __normal_iterator<const_tcu::Vector<int,_4>_*,_std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>_>
             ::operator->(&local_88);
    iVar2 = tcu::Vector<int,_4>::x(pVVar8);
    pVVar8 = __gnu_cxx::
             __normal_iterator<const_tcu::Vector<int,_4>_*,_std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>_>
             ::operator->(&local_88);
    oldVal = tcu::Vector<int,_4>::y(pVVar8);
    pVVar8 = __gnu_cxx::
             __normal_iterator<const_tcu::Vector<int,_4>_*,_std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>_>
             ::operator->(&local_88);
    iVar3 = tcu::Vector<int,_4>::z(pVVar8);
    pVVar8 = __gnu_cxx::
             __normal_iterator<const_tcu::Vector<int,_4>_*,_std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>_>
             ::operator->(&local_88);
    iVar4 = tcu::Vector<int,_4>::w(pVVar8);
    iVar4 = oldVal + iVar4;
    for (; newVal = iVar2, oldVal < iVar4; oldVal = oldVal + 1) {
      for (; newVal < iVar2 + iVar3; newVal = newVal + 1) {
        iVar5 = tcu::ConstPixelBufferAccess::getPixStencil(pCStack_10,newVal,oldVal,0);
        tcu::PixelBufferAccess::setPixStencil
                  ((PixelBufferAccess *)pCStack_10,
                   iVar5 + 1U &
                   rects.
                   super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,newVal,oldVal,0);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_tcu::Vector<int,_4>_*,_std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>_>
    ::operator++(&local_88);
  }
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_70);
  return;
}

Assistant:

static void renderTestPatternReference (const tcu::PixelBufferAccess& dst)
{
	const int		stencilBits		= tcu::getTextureFormatBitDepth(tcu::getEffectiveDepthStencilAccess(dst, tcu::Sampler::MODE_STENCIL).getFormat()).x();
	const deUint32	stencilMask		= (1u<<stencilBits)-1u;
	vector<IVec4>	rects;

	DE_ASSERT(dst.getFormat().order == TextureFormat::S || dst.getFormat().order == TextureFormat::DS);

	// clear depth and stencil
	if (dst.getFormat().order == TextureFormat::DS)
		tcu::clearDepth(dst, 0.0f);
	tcu::clearStencil(dst, 0u);

	genTestRects(rects, dst.getWidth(), dst.getHeight());

	for (vector<IVec4>::const_iterator rectIter = rects.begin(); rectIter != rects.end(); ++rectIter)
	{
		const int	x0		= rectIter->x();
		const int	y0		= rectIter->y();
		const int	x1		= x0+rectIter->z();
		const int	y1		= y0+rectIter->w();

		for (int y = y0; y < y1; y++)
		{
			for (int x = x0; x < x1; x++)
			{
				const int oldVal	= dst.getPixStencil(x, y);
				const int newVal	= (oldVal+1)&stencilMask;

				dst.setPixStencil(newVal, x, y);
			}
		}
	}
}